

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QSize __thiscall QMainWindowLayoutState::minimumSize(QMainWindowLayoutState *this)

{
  long in_FS_OFFSET;
  QSize result;
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.wd.m_i = 0;
  local_20.ht.m_i = 0;
  local_20 = QDockAreaLayout::minimumSize(&this->dockAreaLayout);
  local_20 = QToolBarAreaLayout::minimumSize(&this->toolBarAreaLayout,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

QSize QMainWindowLayoutState::minimumSize() const
{
    QSize result(0, 0);

#if QT_CONFIG(dockwidget)
    result = dockAreaLayout.minimumSize();
#else
    if (centralWidgetItem)
        result = centralWidgetItem->minimumSize();
#endif

#if QT_CONFIG(toolbar)
    result = toolBarAreaLayout.minimumSize(result);
#endif // QT_CONFIG(toolbar)

    return result;
}